

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O0

Result * cppqc::
         quickCheckOutput<Rectangle,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
                   (Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
                    *prop,ostream *out,size_t maxSuccess,size_t maxDiscarded,size_t maxSize,
                   duration<double,_std::ratio<1L,_1L>_> shrinkTimeout,SeedType seed)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  ostream *poVar7;
  ulong in_RCX;
  ostream *in_RDX;
  long *in_RSI;
  char *pcVar8;
  Result *in_RDI;
  long in_R8;
  long in_R9;
  SeedType SStack0000000000000008;
  multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  labels;
  pair<unsigned_long,_std::tuple<Rectangle>_> shrinkRes;
  size_t numShrinks;
  bool success;
  Input in;
  size_t size;
  RngEngine rng;
  size_t numTrivial;
  size_t numDiscarded;
  size_t numSuccess;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  labelsCollected;
  Result *ret;
  multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffe988;
  RngEngine *in_stack_ffffffffffffe990;
  Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  *in_stack_ffffffffffffe998;
  Input *in_stack_ffffffffffffe9a0;
  Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  *in_stack_ffffffffffffe9a8;
  ostream *in_stack_ffffffffffffe9c0;
  key_type *in_stack_ffffffffffffe9c8;
  ostream *in_stack_ffffffffffffe9d0;
  undefined7 in_stack_ffffffffffffe9d8;
  undefined1 in_stack_ffffffffffffe9df;
  ostream *in_stack_ffffffffffffe9e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffea08;
  ostream *in_stack_ffffffffffffea10;
  Input *in_stack_ffffffffffffea18;
  Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  *in_stack_ffffffffffffea20;
  duration<double,_std::ratio<1L,_1L>_> in_stack_ffffffffffffea28;
  ulong local_1488;
  string local_1470 [39];
  byte local_1449;
  SeedType in_stack_ffffffffffffebc0;
  long local_b0;
  ulong local_a0;
  string local_58 [32];
  long local_38;
  long local_30;
  ulong local_28;
  ostream *local_20;
  long *local_18;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  poVar3 = std::operator<<(in_RDX,"* Checking property \"");
  (**(code **)(*local_18 + 8))();
  poVar3 = std::operator<<(poVar3,local_58);
  poVar3 = std::operator<<(poVar3,"\" ...");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_58);
  if (local_30 == 0) {
    local_30 = local_28 * 5;
  }
  if (local_38 == 0) {
    local_38 = 100;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         *)0x11466f);
  local_a0 = 0;
  local_b0 = 0;
  SStack0000000000000008 = detail::resolveSeed(in_stack_ffffffffffffebc0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            (in_stack_ffffffffffffe990,(result_type_conflict)in_stack_ffffffffffffe988);
  do {
    if (local_28 <= local_a0) {
      detail::convertLabels(in_stack_ffffffffffffea08);
      bVar2 = (**(code **)*local_18)();
      if ((bVar2 & 1) == 0) {
        poVar3 = std::operator<<(local_20,"*** Failed! Expected failure but passed ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_a0);
        std::operator<<(poVar3," tests");
        if (local_b0 != 0) {
          poVar3 = std::operator<<(local_20," (");
          in_stack_ffffffffffffe990 =
               (RngEngine *)std::ostream::operator<<(poVar3,(ulong)(local_b0 * 100) / local_a0);
          std::operator<<((ostream *)in_stack_ffffffffffffe990,"% trivial)");
        }
        poVar3 = std::operator<<(local_20,'.');
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        detail::outputLabels
                  (in_stack_ffffffffffffe9d0,(size_t)in_stack_ffffffffffffe9c8,
                   (multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_ffffffffffffe9c0);
        Result::Result((Result *)0x1152df);
        in_RDI->result = QC_NO_EXPECTED_FAILURE;
        in_RDI->numTests = local_a0;
        std::
        multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=((multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_ffffffffffffe990,
                    (multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)poVar3);
        in_RDI->seed = SStack0000000000000008;
      }
      else {
        poVar3 = std::operator<<(local_20,"+++ OK, passed ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar3,local_a0);
        std::operator<<(poVar6," tests");
        if (local_b0 != 0) {
          in_stack_ffffffffffffe9c0 = std::operator<<(local_20," (");
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             (in_stack_ffffffffffffe9c0,(ulong)(local_b0 * 100) / local_a0);
          std::operator<<(poVar7,"% trivial)");
        }
        poVar7 = std::operator<<(local_20,'.');
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        detail::outputLabels
                  (poVar3,(size_t)poVar6,
                   (multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_ffffffffffffe9c0);
        Result::Result((Result *)0x11513c);
        in_RDI->result = QC_SUCCESS;
        in_RDI->numTests = local_a0;
        std::
        multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=((multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe988);
        in_RDI->seed = SStack0000000000000008;
      }
      std::
      multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~multimap((multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x11537c);
LAB_0011538d:
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)0x11539a);
      return in_RDI;
    }
    uVar4 = (local_a0 * local_38) / local_28;
    Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
    ::generateInput(in_stack_ffffffffffffe998,in_stack_ffffffffffffe990,
                    (size_t)in_stack_ffffffffffffe988);
    local_1449 = 0;
    local_1449 = Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
                 ::checkInput((Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
                               *)in_stack_ffffffffffffe990,(Input *)in_stack_ffffffffffffe988);
    bVar1 = Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
            ::trivialInput((Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
                            *)in_stack_ffffffffffffe990,(Input *)in_stack_ffffffffffffe988);
    if (bVar1) {
      local_b0 = local_b0 + 1;
    }
    Property<Rectangle,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
    ::classifyInput_abi_cxx11_(in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9a0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           *)in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8);
    *pmVar5 = *pmVar5 + 1;
    std::__cxx11::string::~string(local_1470);
    if ((local_1449 & 1) == 0) {
      bVar2 = (**(code **)*local_18)();
      if ((bVar2 & 1) == 0) {
        std::operator<<(local_20,"+++ OK, failed as expected. ");
      }
      else {
        std::operator<<(local_20,"*** Failed! ");
      }
      poVar3 = std::operator<<(local_20,"Starting shrinking...");
      std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
      detail::
      doShrink<Rectangle,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
                (in_stack_ffffffffffffea20,in_stack_ffffffffffffea18,in_stack_ffffffffffffea28,
                 in_stack_ffffffffffffea10);
      std::tuple<Rectangle>::operator=
                ((tuple<Rectangle> *)in_stack_ffffffffffffe990,(type)in_stack_ffffffffffffe988);
      std::operator<<(local_20,"done\n");
      poVar3 = std::operator<<(local_20,"Falsifiable after ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_a0 + 1);
      pcVar8 = " tests";
      if (local_a0 == 0) {
        pcVar8 = " test";
      }
      std::operator<<(poVar3,pcVar8);
      if (local_1488 != 0) {
        poVar3 = std::operator<<(local_20," and ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1488);
        pcVar8 = " shrinks";
        if (local_1488 == 1) {
          pcVar8 = " shrink";
        }
        std::operator<<(poVar3,pcVar8);
      }
      std::operator<<(local_20," for input:\n");
      printInput<Rectangle>
                (in_stack_ffffffffffffe9e0,
                 (tuple<Rectangle> *)CONCAT17(in_stack_ffffffffffffe9df,in_stack_ffffffffffffe9d8));
      poVar3 = std::operator<<(local_20,"(To reproduce the test, use ");
      poVar3 = std::operator<<(poVar3,"CPPQUICKCHECK_SEED");
      poVar3 = std::operator<<(poVar3,'=');
      poVar6 = (ostream *)std::ostream::operator<<(poVar3,SStack0000000000000008);
      std::operator<<(poVar6,")\n");
      bVar2 = (**(code **)*local_18)();
      if ((bVar2 & 1) == 0) {
        Result::Result((Result *)0x114d6a);
        in_RDI->result = QC_SUCCESS;
        in_RDI->numTests = local_a0 + 1;
        detail::convertLabels
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)poVar3);
        std::
        multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=((multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe988);
        std::
        multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~multimap((multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x114dc4);
        in_RDI->seed = SStack0000000000000008;
      }
      else {
        while (pcVar8 = getenv("CPPQUICKCHECK_LOOP_FAILING_TESTS"), pcVar8 != (char *)0x0) {
          std::operator<<(local_20,"Looping failing test...\n");
          Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
          ::checkInput((Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
                        *)in_stack_ffffffffffffe990,(Input *)in_stack_ffffffffffffe988);
        }
        Result::Result((Result *)0x114c7a);
        in_RDI->result = QC_FAILURE;
        in_RDI->numTests = local_a0 + 1;
        detail::convertLabels
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)poVar3);
        std::
        multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=((multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe988);
        std::
        multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~multimap((multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x114cd4);
        in_RDI->seed = SStack0000000000000008;
        in_RDI->numShrinks = local_1488;
        in_RDI->usedSize = uVar4;
      }
      goto LAB_0011538d;
    }
    local_a0 = local_a0 + 1;
  } while( true );
}

Assistant:

Result quickCheckOutput(
    const Property<T0, T1, T2, T3, T4>& prop,
    std::ostream& out = std::cout,
    std::size_t maxSuccess = 100,
    std::size_t maxDiscarded = 0,
    std::size_t maxSize = 0,
    std::chrono::duration<double> shrinkTimeout = DEFAULT_SHRINK_TIMEOUT,
    SeedType seed = USE_DEFAULT_SEED) {
  using Input = typename Property<T0, T1, T2, T3, T4>::Input;

  out << "* Checking property \"" << prop.name() << "\" ..." << std::endl;

  if (maxDiscarded == 0)
    maxDiscarded = maxSuccess * 5;
  if (maxSize == 0)
    maxSize = 100;

  std::map<std::string, std::size_t> labelsCollected;
  std::size_t numSuccess = 0, numDiscarded = 0, numTrivial = 0;

  seed = detail::resolveSeed(seed);
  RngEngine rng{seed};
  while (numSuccess < maxSuccess) {
    std::size_t size = (numSuccess * maxSize + numDiscarded) / maxSuccess;
    Input in = prop.generateInput(rng, size);
    try {
      bool success = false;
      try {
        success = prop.checkInput(in);
      } catch (...) {
        out << "Caught exception checking property...\n";
      }

      if (prop.trivialInput(in))
        ++numTrivial;
      ++labelsCollected[prop.classifyInput(in)];

      if (success) {
        ++numSuccess;
      } else {
        if (prop.expect()) {
          out << "*** Failed! ";
        } else {
          out << "+++ OK, failed as expected. ";
        }

        std::size_t numShrinks = 0;
        try {
          out << "Starting shrinking..." << std::flush;
          std::pair<std::size_t, Input> shrinkRes =
              detail::doShrink(prop, in, shrinkTimeout, out);
          numShrinks = shrinkRes.first;
          in = shrinkRes.second;
          out << "done\n";
        } catch (...) {
          out << "WARN: Aborted shrinking because an exception was thrown\n";
        }
        out << "Falsifiable after " << numSuccess + 1
            << (numSuccess == 0 ? " test" : " tests");
        if (numShrinks > 0) {
          out << " and " << numShrinks
              << (numShrinks == 1 ? " shrink" : " shrinks");
        }
        out << " for input:\n";
        printInput(out, in);
        out << "(To reproduce the test, use " << CPPQUICKCHECK_SEED_ENV << '='
            << seed << ")\n";

        if (prop.expect()) {
          while (getenv(CPPQUICKCHECK_LOOP_FAILING_TESTS_ENV) != nullptr) {
            out << "Looping failing test...\n";
            prop.checkInput(in);
          }
          Result ret;
          ret.result = QC_FAILURE;
          ret.numTests = numSuccess + 1;
          ret.labels = detail::convertLabels(labelsCollected);
          ret.seed = seed;
          ret.numShrinks = numShrinks;
          ret.usedSize = size;
          return ret;
        } else {
          Result ret;
          ret.result = QC_SUCCESS;
          ret.numTests = numSuccess + 1;
          ret.labels = detail::convertLabels(labelsCollected);
          ret.seed = seed;
          return ret;
        }
      }
    } catch (...) {
      if (++numDiscarded >= maxDiscarded) {
        out << "*** Gave up! Passed only " << numSuccess << " tests."
            << std::endl;

        Result ret;
        ret.result = QC_GAVE_UP;
        ret.numTests = numSuccess;
        ret.labels = detail::convertLabels(labelsCollected);
        ret.seed = seed;
        return ret;
      }
    }
  }

  std::multimap<std::size_t, std::string> labels =
      detail::convertLabels(labelsCollected);

  if (prop.expect()) {
    out << "+++ OK, passed " << numSuccess << " tests";
    if (numTrivial != 0)
      out << " (" << (100 * numTrivial / numSuccess) << "% trivial)";
    out << '.' << std::endl;
    detail::outputLabels(out, numSuccess, labels);

    Result ret;
    ret.result = QC_SUCCESS;
    ret.numTests = numSuccess;
    ret.labels = labels;
    ret.seed = seed;
    return ret;
  } else {
    out << "*** Failed! Expected failure but passed " << numSuccess << " tests";
    if (numTrivial != 0)
      out << " (" << (100 * numTrivial / numSuccess) << "% trivial)";
    out << '.' << std::endl;
    detail::outputLabels(out, numSuccess, labels);

    Result ret;
    ret.result = QC_NO_EXPECTED_FAILURE;
    ret.numTests = numSuccess;
    ret.labels = labels;
    ret.seed = seed;
    return ret;
  }
}